

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

BailOutInstrTemplate<IR::ProfiledInstr> *
IR::BailOutInstrTemplate<IR::ProfiledInstr>::New
          (OpCode opcode,BailOutKind kind,BailOutInfo *bailOutInfo,Func *func)

{
  undefined1 *puVar1;
  Instr *this;
  code *pcVar2;
  bool bVar3;
  BailOutKind BVar4;
  undefined4 *puVar5;
  BailOutInstrTemplate<IR::ProfiledInstr> *this_00;
  
  if (bailOutInfo->bailOutFunc != func) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x5c0,"(func == bailOutInfo->bailOutFunc)",
                       "func == bailOutInfo->bailOutFunc");
    if (!bVar3) goto LAB_004c5a3f;
    *puVar5 = 0;
  }
  bVar3 = IsValidBailOutKindAndBits(kind);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x5c1,"(IsValidBailOutKindAndBits(kind))","IsValidBailOutKindAndBits(kind)")
    ;
    if (!bVar3) {
LAB_004c5a3f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  this_00 = (BailOutInstrTemplate<IR::ProfiledInstr> *)
            new<Memory::JitArenaAllocator>(0x70,func->m_alloc,0x3f1274);
  (this_00->super_ProfiledInstr).super_Instr.m_noLazyHelperAssert = false;
  (this_00->super_ProfiledInstr).super_Instr.m_next = (Instr *)0x0;
  (this_00->super_ProfiledInstr).super_Instr.m_prev = (Instr *)0x0;
  (this_00->super_ProfiledInstr).super_Instr.m_func = (Func *)0x0;
  (this_00->super_ProfiledInstr).super_Instr.globOptInstrString = (char16 *)0x0;
  (this_00->super_ProfiledInstr).super_Instr.m_opcode = MaxByteSizedOpcodes;
  (this_00->super_ProfiledInstr).super_Instr.ignoreOverflowBitCount = ' ';
  (this_00->super_ProfiledInstr).super_Instr.highlight = 0;
  puVar1 = &(this_00->super_ProfiledInstr).super_Instr.field_0x36;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 1;
  (this_00->super_ProfiledInstr).super_Instr.field_0x38 =
       (this_00->super_ProfiledInstr).super_Instr.field_0x38 & 0x80 | 0x10;
  (this_00->super_ProfiledInstr).super_Instr.m_number = 0xffffffff;
  (this_00->super_ProfiledInstr).super_Instr.m_dst = (Opnd *)0x0;
  (this_00->super_ProfiledInstr).super_Instr.m_src1 = (Opnd *)0x0;
  (this_00->super_ProfiledInstr).super_Instr.m_src2 = (Opnd *)0x0;
  (this_00->super_ProfiledInstr).super_Instr._vptr_Instr = (_func_int **)&PTR_Dump_014ea958;
  Instr::Init((Instr *)this_00,opcode,InstrKindProfiled,func);
  bailOutInfo->bailOutOpcode = opcode;
  this_00->bailOutInfo = bailOutInfo;
  this_00->bailOutKind = kind;
  this_00->auxBailOutKind = BailOutInvalid;
  this = bailOutInfo->bailOutInstr;
  if (this == (Instr *)0x0) {
    bailOutInfo->bailOutInstr = (Instr *)this_00;
  }
  else if (bailOutInfo->sharedBailOutKind == true) {
    if ((this->field_0x38 & 0x10) == 0) {
      bailOutInfo->sharedBailOutKind = false;
    }
    else {
      BVar4 = Instr::GetBailOutKind(this);
      bailOutInfo->sharedBailOutKind = BVar4 == kind;
    }
  }
  func->field_0x240 = func->field_0x240 | 0x10;
  JITOutput::SetHasBailoutInstr(&func->m_output,true);
  return this_00;
}

Assistant:

BailOutInstrTemplate<InstrType> *
BailOutInstrTemplate<InstrType>::New(Js::OpCode opcode, BailOutKind kind, BailOutInfo * bailOutInfo, Func * func)
{
    Assert(func == bailOutInfo->bailOutFunc);
    Assert(IsValidBailOutKindAndBits(kind));
    BailOutInstrTemplate * bailOutInstr = JitAnew(func->m_alloc, BailOutInstrTemplate);
    bailOutInstr->Init(opcode, IRKindMap<InstrType>::InstrKind, func);
#if ENABLE_DEBUG_CONFIG_OPTIONS
    bailOutInfo->bailOutOpcode = opcode;
#endif
    bailOutInstr->bailOutInfo = bailOutInfo;
    bailOutInstr->bailOutKind = kind;
    bailOutInstr->auxBailOutKind = BailOutInvalid;

    if (bailOutInfo->bailOutInstr == nullptr)
    {
        bailOutInfo->bailOutInstr = bailOutInstr;
    }
    else if (bailOutInfo->sharedBailOutKind)
    {
        if (bailOutInfo->bailOutInstr->HasBailOutInfo())
        {
            bailOutInfo->sharedBailOutKind = bailOutInfo->bailOutInstr->GetBailOutKind() ==  kind;
        }
        else
        {
            // Rare cases where we have already generated the bailout record. Unlikely they share the same bailout kind as this is hit only when we try to
            // share bailout in lowerer. See Instr::ShareBailOut.
            bailOutInfo->sharedBailOutKind = false;
        }
    }

    func->hasBailout = true;

    // Indicate that the function has bailout instructions
    // This information is used to determine whether to free jitted loop bodies
    // If the function has bailout instructions, we keep the loop bodies alive
    // in case we bail out to the interpreter, so that we can reuse the jitted
    // loop bodies
    func->GetJITOutput()->SetHasBailoutInstr(true);

    return bailOutInstr;
}